

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

Kit_Node_t * Kit_GraphAppendNode(Kit_Graph_t *pGraph)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  Kit_Node_t *local_20;
  Kit_Node_t *pNode;
  Kit_Graph_t *pGraph_local;
  
  if (pGraph->nSize == pGraph->nCap) {
    if (pGraph->pNodes == (Kit_Node_t *)0x0) {
      local_20 = (Kit_Node_t *)malloc((long)(pGraph->nCap << 1) * 0x18);
    }
    else {
      local_20 = (Kit_Node_t *)realloc(pGraph->pNodes,(long)(pGraph->nCap << 1) * 0x18);
    }
    pGraph->pNodes = local_20;
    pGraph->nCap = pGraph->nCap << 1;
  }
  pKVar2 = pGraph->pNodes;
  iVar1 = pGraph->nSize;
  pGraph->nSize = iVar1 + 1;
  memset(pKVar2 + iVar1,0,0x18);
  return pKVar2 + iVar1;
}

Assistant:

Kit_Node_t * Kit_GraphAppendNode( Kit_Graph_t * pGraph )   
{
    Kit_Node_t * pNode;
    if ( pGraph->nSize == pGraph->nCap )
    {
        pGraph->pNodes = ABC_REALLOC( Kit_Node_t, pGraph->pNodes, 2 * pGraph->nCap ); 
        pGraph->nCap   = 2 * pGraph->nCap;
    }
    pNode = pGraph->pNodes + pGraph->nSize++;
    memset( pNode, 0, sizeof(Kit_Node_t) );
    return pNode;
}